

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

bool __thiscall EdgeData::operator<(EdgeData *this,EdgeData *other)

{
  EdgeData *other_local;
  EdgeData *this_local;
  bool local_1;
  
  if (other->width <= this->width) {
    if (this->width < other->width || this->width == other->width) {
      if ((int)this->edgeClass < (int)other->edgeClass) {
        local_1 = true;
      }
      else if ((int)other->edgeClass < (int)this->edgeClass) {
        local_1 = false;
      }
      else if ((this->edge == TopEdge) && (other->edge == BottomEdge)) {
        local_1 = true;
      }
      else if ((this->edge == BottomEdge) && (other->edge == TopEdge)) {
        local_1 = false;
      }
      else if ((this->edge == LeftEdge) && (other->edge == RightEdge)) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool operator< (const EdgeData &other) const {
        if (width < other.width) return true;
        if (width > other.width) return false;
        if (edgeClass < other.edgeClass) return true;
        if (edgeClass > other.edgeClass) return false;
        if (edge == QCss::TopEdge && other.edge == QCss::BottomEdge) return true;
        if (edge == QCss::BottomEdge && other.edge == QCss::TopEdge) return false;
        if (edge == QCss::LeftEdge && other.edge == QCss::RightEdge) return true;
        return false;
    }